

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall chatra::RuntimeImp::initialize(RuntimeImp *this,uint initialThreadCount)

{
  EVP_PKEY_CTX *src;
  
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  StringTable::newInstance();
  std::__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->primarySTable).
              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  StringTable::copy((StringTable *)&stack0xffffffffffffffd0,
                    (EVP_PKEY_CTX *)
                    (this->primarySTable).
                    super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,src);
  std::__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->distributedSTable).
              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  launchStorage(this);
  launchFinalizerThread(this);
  launchSystem(this,initialThreadCount);
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount) {
	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	primarySTable = StringTable::newInstance();
	distributedSTable = primarySTable->copy();

	launchStorage();
	launchFinalizerThread();
	launchSystem(initialThreadCount);
}